

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcUniformBlockTests.cpp
# Opt level: O3

int __thiscall
deqp::BlockSingleNestedStructArrayCase::init
          (BlockSingleNestedStructArrayCase *this,EVP_PKEY_CTX *ctx)

{
  vector<deqp::ub::Uniform,_std::allocator<deqp::ub::Uniform>_> *this_00;
  ShaderInterface *this_01;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  deUint32 dVar2;
  StructType *this_02;
  StructType *this_03;
  UniformBlock *pUVar3;
  VarType local_a0;
  Uniform local_88;
  VarType local_48;
  
  this_01 = &(this->super_UniformBlockCase).m_interface;
  this_02 = ub::ShaderInterface::allocStruct(this_01,"S");
  ub::VarType::VarType((VarType *)&local_88,TYPE_INT_VEC3,4);
  ub::StructType::addMember(this_02,"a",(VarType *)&local_88,0);
  ub::VarType::~VarType((VarType *)&local_88);
  ub::VarType::VarType(&local_a0,TYPE_INT_VEC2,2);
  ub::VarType::VarType((VarType *)&local_88,&local_a0,4);
  ub::StructType::addMember(this_02,"b",(VarType *)&local_88,0);
  ub::VarType::~VarType((VarType *)&local_88);
  ub::VarType::~VarType(&local_a0);
  ub::VarType::VarType((VarType *)&local_88,TYPE_FLOAT_VEC4,4);
  ub::StructType::addMember(this_02,"c",(VarType *)&local_88,0xc00);
  ub::VarType::~VarType((VarType *)&local_88);
  this_03 = ub::ShaderInterface::allocStruct(this_01,"T");
  ub::VarType::VarType((VarType *)&local_88,TYPE_FLOAT_MAT3,2);
  ub::StructType::addMember(this_03,"a",(VarType *)&local_88,0);
  ub::VarType::~VarType((VarType *)&local_88);
  ub::VarType::VarType(&local_a0,this_02);
  ub::VarType::VarType((VarType *)&local_88,&local_a0,3);
  ub::StructType::addMember(this_03,"b",(VarType *)&local_88,0);
  ub::VarType::~VarType((VarType *)&local_88);
  ub::VarType::~VarType(&local_a0);
  pUVar3 = ub::ShaderInterface::allocBlock(this_01,"Block");
  ub::VarType::VarType(&local_a0,this_02);
  ub::Uniform::Uniform(&local_88,"s",&local_a0,0);
  this_00 = &pUVar3->m_uniforms;
  std::vector<deqp::ub::Uniform,_std::allocator<deqp::ub::Uniform>_>::push_back(this_00,&local_88);
  ub::VarType::~VarType(&local_88.m_type);
  paVar1 = &local_88.m_name.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88.m_name._M_dataplus._M_p != paVar1) {
    operator_delete(local_88.m_name._M_dataplus._M_p,
                    local_88.m_name.field_2._M_allocated_capacity + 1);
  }
  ub::VarType::~VarType(&local_a0);
  ub::VarType::VarType(&local_a0,TYPE_FLOAT_VEC2,1);
  ub::Uniform::Uniform(&local_88,"v",&local_a0,0xc00);
  std::vector<deqp::ub::Uniform,_std::allocator<deqp::ub::Uniform>_>::push_back(this_00,&local_88);
  ub::VarType::~VarType(&local_88.m_type);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88.m_name._M_dataplus._M_p != paVar1) {
    operator_delete(local_88.m_name._M_dataplus._M_p,
                    local_88.m_name.field_2._M_allocated_capacity + 1);
  }
  ub::VarType::~VarType(&local_a0);
  ub::VarType::VarType(&local_48,this_03);
  ub::VarType::VarType(&local_a0,&local_48,2);
  ub::Uniform::Uniform(&local_88,"t",&local_a0,0);
  std::vector<deqp::ub::Uniform,_std::allocator<deqp::ub::Uniform>_>::push_back(this_00,&local_88);
  ub::VarType::~VarType(&local_88.m_type);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88.m_name._M_dataplus._M_p != paVar1) {
    operator_delete(local_88.m_name._M_dataplus._M_p,
                    local_88.m_name.field_2._M_allocated_capacity + 1);
  }
  ub::VarType::~VarType(&local_a0);
  ub::VarType::~VarType(&local_48);
  ub::VarType::VarType(&local_a0,TYPE_UINT,4);
  ub::Uniform::Uniform(&local_88,"u",&local_a0,0);
  std::vector<deqp::ub::Uniform,_std::allocator<deqp::ub::Uniform>_>::push_back(this_00,&local_88);
  ub::VarType::~VarType(&local_88.m_type);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88.m_name._M_dataplus._M_p != paVar1) {
    operator_delete(local_88.m_name._M_dataplus._M_p,
                    local_88.m_name.field_2._M_allocated_capacity + 1);
  }
  ub::VarType::~VarType(&local_a0);
  dVar2 = this->m_layoutFlags;
  pUVar3->m_flags = dVar2;
  if (0 < this->m_numInstances) {
    std::__cxx11::string::_M_replace
              ((ulong)&pUVar3->m_instanceName,0,(char *)(pUVar3->m_instanceName)._M_string_length,
               0x1c444de);
    dVar2 = this->m_numInstances;
    pUVar3->m_arraySize = dVar2;
  }
  return dVar2;
}

Assistant:

void init(void)
	{
		StructType& typeS = m_interface.allocStruct("S");
		typeS.addMember("a", VarType(glu::TYPE_INT_VEC3, PRECISION_HIGH));
		typeS.addMember("b", VarType(VarType(glu::TYPE_INT_VEC2, PRECISION_MEDIUM), 4));
		typeS.addMember("c", VarType(glu::TYPE_FLOAT_VEC4, PRECISION_HIGH), UNUSED_BOTH);

		StructType& typeT = m_interface.allocStruct("T");
		typeT.addMember("a", VarType(glu::TYPE_FLOAT_MAT3, PRECISION_MEDIUM));
		typeT.addMember("b", VarType(VarType(&typeS), 3));

		UniformBlock& block = m_interface.allocBlock("Block");
		block.addUniform(Uniform("s", VarType(&typeS), 0));
		block.addUniform(Uniform("v", VarType(glu::TYPE_FLOAT_VEC2, PRECISION_LOW), UNUSED_BOTH));
		block.addUniform(Uniform("t", VarType(VarType(&typeT), 2), 0));
		block.addUniform(Uniform("u", VarType(glu::TYPE_UINT, PRECISION_HIGH), 0));
		block.setFlags(m_layoutFlags);

		if (m_numInstances > 0)
		{
			block.setInstanceName("block");
			block.setArraySize(m_numInstances);
		}
	}